

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O2

int Abc_NtkIvyProve(Abc_Ntk_t **ppNtk,void *pPars)

{
  DdNode *pDVar1;
  uint uVar2;
  int fVerbose;
  Abc_Obj_t *pAVar3;
  Aig_Man_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  int *piVar7;
  DdNode *pDVar8;
  Ivy_Man_t *pMan;
  char pFileName [100];
  
  pAVar5 = *ppNtk;
  if (pAVar5->ntkType == ABC_NTK_LOGIC) {
    pAVar6 = Abc_NtkStrash(pAVar5,0,1,0);
    Abc_NtkDelete(pAVar5);
  }
  else {
    pAVar6 = pAVar5;
    if (pAVar5->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                    ,0x1fe,"int Abc_NtkIvyProve(Abc_Ntk_t **, void *)");
    }
  }
  uVar2 = 0;
  pAVar3 = Abc_NtkPo(pAVar6,0);
  if (((*(uint *)&pAVar3->field_0x14 >> 10 ^
       *(uint *)((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x14) >> 7) & 1) ==
      0) {
    pAVar4 = Abc_NtkToDar(pAVar6,0,0);
    uVar2 = Fra_FraigSat(pAVar4,(long)*(int *)((long)pPars + 0x14),0,0,0,0,1,0,0,0);
    pAVar6->pModel = (int *)pAVar4->pData;
    pAVar4->pData = (void *)0x0;
    Aig_ManStop(pAVar4);
    if ((int)uVar2 < 0) {
      if ((*(int *)((long)pPars + 4) != 0) && (500 < pAVar6->nObjCounts[7])) {
        *(undefined4 *)((long)pPars + 4) = 0;
        pAVar5 = Abc_NtkBalance(pAVar6,0,0,0);
        Abc_NtkDelete(pAVar6);
        Abc_NtkRewrite(pAVar5,0,0,0,0,0);
        pAVar6 = Abc_NtkBalance(pAVar5,0,0,0);
        Abc_NtkDelete(pAVar5);
        Abc_NtkRewrite(pAVar6,0,0,0,0,0);
        Abc_NtkRefactor(pAVar6,10,0x10,0,0,0,0);
      }
      pMan = Abc_NtkIvyBefore(pAVar6,0,0);
      uVar2 = Ivy_FraigProve(&pMan,pPars);
      pAVar5 = Abc_NtkIvyAfter(pAVar6,pMan,0,0);
      Abc_NtkDelete(pAVar6);
      pAVar5->pModel = (int *)pMan->pData;
      pMan->pData = (void *)0x0;
      Ivy_ManStop(pMan);
      if ((int)uVar2 < 0) {
        pAVar4 = Abc_NtkToDar(pAVar5,0,0);
        fVerbose = 0;
        if (*(int *)((long)pPars + 0xc) != 0) {
          builtin_strncpy(pFileName + 8,".aig",5);
          builtin_strncpy(pFileName,"cecmiter",8);
          Ioa_WriteAiger(pAVar4,pFileName,0,0);
          printf("Intermediate reduced miter is written into file \"%s\".\n",pFileName);
          fVerbose = *(int *)((long)pPars + 0xc);
        }
        uVar2 = Fra_FraigSat(pAVar4,(long)*(int *)((long)pPars + 0x34),0,0,0,0,0,0,0,fVerbose);
        pAVar5->pModel = (int *)pAVar4->pData;
        pAVar4->pData = (void *)0x0;
        Aig_ManStop(pAVar4);
        if (((int)uVar2 < 0) && (*(int *)((long)pPars + 8) != 0)) {
          if (*(int *)((long)pPars + 0xc) != 0) {
            printf("Attempting BDDs with node limit %d ...\n",(ulong)*(uint *)((long)pPars + 0x2c));
            fflush(_stdout);
          }
          pAVar6 = Abc_NtkCollapse(pAVar5,*(int *)((long)pPars + 0x2c),0,
                                   *(int *)((long)pPars + 0x30),0,0,0);
          if (pAVar6 != (Abc_Ntk_t *)0x0) {
            Abc_NtkDelete(pAVar5);
            pAVar5 = pAVar6;
            if (pAVar6->nObjCounts[7] == 1) {
              pAVar3 = Abc_NtkPo(pAVar6,0);
              pDVar1 = *(DdNode **)
                        ((long)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray] + 0x38);
              pDVar8 = Cudd_ReadLogicZero((DdManager *)pAVar6->pManFunc);
              uVar2 = (uint)(pDVar1 == pDVar8);
            }
            else {
              uVar2 = 0;
            }
          }
        }
      }
      *ppNtk = pAVar5;
    }
  }
  else {
    piVar7 = (int *)calloc((long)pAVar6->vCis->nSize,4);
    pAVar6->pModel = piVar7;
  }
  return uVar2;
}

Assistant:

int Abc_NtkIvyProve( Abc_Ntk_t ** ppNtk, void * pPars )
{
    Prove_Params_t * pParams = (Prove_Params_t *)pPars;
    Abc_Ntk_t * pNtk = *ppNtk, * pNtkTemp;
    Abc_Obj_t * pObj, * pFanin;
    Ivy_Man_t * pMan;
    Aig_Man_t * pMan2;
    int RetValue;
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    // experiment with various parameters settings
//    pParams->fUseBdds = 1;
//    pParams->fBddReorder = 1;
//    pParams->nTotalBacktrackLimit = 10000;
 
    // strash the network if it is not strashed already
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash( pNtkTemp = pNtk, 0, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
    }
 
    // check the case when the 0000 simulation pattern detect the bug
    pObj = Abc_NtkPo(pNtk,0);
    pFanin = Abc_ObjFanin0(pObj);
    if ( Abc_ObjFanin0(pObj)->fPhase != (unsigned)Abc_ObjFaninC0(pObj) )
    {
        pNtk->pModel = ABC_CALLOC( int, Abc_NtkCiNum(pNtk) );
        return 0;
    }

    // changed in "src\sat\fraig\fraigMan.c"
    //    pParams->nMiteringLimitStart  = 300;    // starting mitering limit
    // to be
    //    pParams->nMiteringLimitStart  = 5000;    // starting mitering limit

    // if SAT only, solve without iteration
//    RetValue = Abc_NtkMiterSat( pNtk, 2*(ABC_INT64_T)pParams->nMiteringLimitStart, (ABC_INT64_T)0, 0, NULL, NULL );
    pMan2 = Abc_NtkToDar( pNtk, 0, 0 );
    RetValue = Fra_FraigSat( pMan2, (ABC_INT64_T)pParams->nMiteringLimitStart, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 ); 
    pNtk->pModel = (int *)pMan2->pData, pMan2->pData = NULL;
    Aig_ManStop( pMan2 );
//    pNtk->pModel = Aig_ManReleaseData( pMan2 );
    if ( RetValue >= 0 )
        return RetValue;

    // apply AIG rewriting
    if ( pParams->fUseRewriting && Abc_NtkNodeNum(pNtk) > 500 )
    {
//        abctime clk = Abc_Clock();
//printf( "Before rwsat = %d. ", Abc_NtkNodeNum(pNtk) );
        pParams->fUseRewriting = 0;
        pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
        Abc_NtkDelete( pNtkTemp );
        Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
        pNtk = Abc_NtkBalance( pNtkTemp = pNtk, 0, 0, 0 );          
        Abc_NtkDelete( pNtkTemp );
        Abc_NtkRewrite( pNtk, 0, 0, 0, 0, 0 );
        Abc_NtkRefactor( pNtk, 10, 16, 0, 0, 0, 0 );
//printf( "After rwsat = %d. ", Abc_NtkNodeNum(pNtk) );
//ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // convert ABC network into IVY network
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );

    // solve the CEC problem
    RetValue = Ivy_FraigProve( &pMan, pParams );
//    RetValue = -1;

    // convert IVY network into ABC network    
    pNtk = Abc_NtkIvyAfter( pNtkTemp = pNtk, pMan, 0, 0 );
    Abc_NtkDelete( pNtkTemp );
    // transfer model if given
    pNtk->pModel = (int *)pMan->pData; pMan->pData = NULL;
    Ivy_ManStop( pMan );

    // try to prove it using brute force SAT with good CNF encoding
    if ( RetValue < 0 )
    {
        pMan2 = Abc_NtkToDar( pNtk, 0, 0 );
        // dump the miter before entering high-effort solving
        if ( pParams->fVerbose )
        {
            char pFileName[100];
            sprintf( pFileName, "cecmiter.aig" );
            Ioa_WriteAiger( pMan2, pFileName, 0, 0 );
            printf( "Intermediate reduced miter is written into file \"%s\".\n", pFileName );
        }
        RetValue = Fra_FraigSat( pMan2, pParams->nMiteringLimitLast, 0, 0, 0, 0, 0, 0, 0, pParams->fVerbose ); 
        pNtk->pModel = (int *)pMan2->pData, pMan2->pData = NULL;
        Aig_ManStop( pMan2 );
    }

    // try to prove it using brute force BDDs
#ifdef ABC_USE_CUDD
    if ( RetValue < 0 && pParams->fUseBdds )
    {
        if ( pParams->fVerbose )
        {
            printf( "Attempting BDDs with node limit %d ...\n", pParams->nBddSizeLimit );
            fflush( stdout );
        }
        pNtk = Abc_NtkCollapse( pNtkTemp = pNtk, pParams->nBddSizeLimit, 0, pParams->fBddReorder, 0, 0, 0 );
        if ( pNtk )   
        {
            Abc_NtkDelete( pNtkTemp );
            RetValue = ( (Abc_NtkNodeNum(pNtk) == 1) && (Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pData == Cudd_ReadLogicZero((DdManager *)pNtk->pManFunc)) );
        }
        else 
            pNtk = pNtkTemp;
    }
#endif

    // return the result
    *ppNtk = pNtk;
    return RetValue;
}